

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cpp
# Opt level: O2

vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_> * __thiscall
Epoll::getEventRequest
          (vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>
           *__return_storage_ptr__,Epoll *this,int events_num)

{
  ulong uVar1;
  ulong uVar2;
  SP_Channel cur_req;
  Logger local_1008;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = 0;
  uVar1 = (ulong)(uint)events_num;
  if (events_num < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 * 0xc - uVar2 != 0; uVar2 = uVar2 + 0xc) {
    std::__shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&cur_req.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>,
               &this->fd2chan_
                [*(int *)((long)&((this->events_).
                                  super__Vector_base<epoll_event,_std::allocator<epoll_event>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->data + uVar2)].
                super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>);
    if (cur_req.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      Logger::Logger(&local_1008,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/Epoll.cpp"
                     ,0x6e);
      if (8 < ((int)&local_1008 + 0xfa8) - (int)local_1008.impl_.stream_.buffer_.cur_) {
        builtin_strncpy(local_1008.impl_.stream_.buffer_.cur_,"SP cur_r",8);
        local_1008.impl_.stream_.buffer_.cur_ = local_1008.impl_.stream_.buffer_.cur_ + 8;
      }
      Logger::~Logger(&local_1008);
    }
    else {
      (cur_req.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->revents_ =
           *(__uint32_t *)
            ((long)&((this->events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>.
                     _M_impl.super__Vector_impl_data._M_start)->events + uVar2);
      (cur_req.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->events_ = 0;
      std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>::push_back
                (__return_storage_ptr__,&cur_req);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&cur_req.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SP_Channel> Epoll::getEventRequest(int events_num){
    std::vector<SP_Channel> req_data;
    for (int i=0; i<events_num; ++i) {
        // 获取有事件产生的描述符
        int fd = events_[i].data.fd;

        SP_Channel cur_req = fd2chan_[fd];

        if (cur_req) {
            cur_req->setRevents(events_[i].events);
            cur_req->setEvents(0);
            // 加入线程池之前将timer和request分离
            // cur_req->seperateTimer();
            req_data.push_back(cur_req);
        }else {
            LOG<<"SP cur_req is invalid";
        }
    }
    return req_data;
}